

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status
json_object_dotset_string_with_len(JSON_Object *object,char *name,char *string,size_t len)

{
  JSON_Status JVar1;
  JSON_Value *value_00;
  JSON_Value *value;
  size_t len_local;
  char *string_local;
  char *name_local;
  JSON_Object *object_local;
  
  value_00 = json_value_init_string_with_len(string,len);
  if (value_00 == (JSON_Value *)0x0) {
    object_local._4_4_ = -1;
  }
  else {
    JVar1 = json_object_dotset_value(object,name,value_00);
    if (JVar1 == 0) {
      object_local._4_4_ = 0;
    }
    else {
      json_value_free(value_00);
      object_local._4_4_ = -1;
    }
  }
  return object_local._4_4_;
}

Assistant:

JSON_Status json_object_dotset_string_with_len(JSON_Object *object, const char *name, const char *string, size_t len) {
    JSON_Value *value = json_value_init_string_with_len(string, len);
    if (value == NULL) {
        return JSONFailure;
    }
    if (json_object_dotset_value(object, name, value) != JSONSuccess) {
        json_value_free(value);
        return JSONFailure;
    }
    return JSONSuccess;
}